

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

llama_sampler * llama_sampler_grammar_clone(llama_sampler *smpl)

{
  long lVar1;
  llama_sampler_context_t pvVar2;
  llama_sampler *plVar3;
  llama_grammar *plVar4;
  long in_RDI;
  llama_sampler_grammar *result_ctx;
  llama_sampler *result;
  llama_sampler_grammar *ctx;
  size_t in_stack_00000130;
  char **in_stack_00000138;
  bool in_stack_00000147;
  char *in_stack_00000148;
  char *in_stack_00000150;
  llama_vocab *in_stack_00000158;
  llama_token *in_stack_00000170;
  size_t in_stack_00000178;
  char **in_stack_00000180;
  size_t in_stack_00000188;
  
  lVar1 = *(long *)(in_RDI + 8);
  plVar3 = llama_sampler_init_grammar_impl
                     (in_stack_00000158,in_stack_00000150,in_stack_00000148,in_stack_00000147,
                      in_stack_00000138,in_stack_00000130,in_stack_00000170,in_stack_00000178,
                      in_stack_00000180,in_stack_00000188);
  if (plVar3 == (llama_sampler *)0x0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-sampling.cpp"
               ,0x5c8,"GGML_ASSERT(%s) failed","result");
  }
  pvVar2 = plVar3->ctx;
  if (*(long *)(lVar1 + 0x48) != 0) {
    std::__cxx11::string::operator=((string *)((long)pvVar2 + 8),(string *)(lVar1 + 8));
    std::__cxx11::string::operator=((string *)((long)pvVar2 + 0x28),(string *)(lVar1 + 0x28));
    plVar4 = llama_grammar_clone_impl((llama_grammar *)smpl);
    *(llama_grammar **)((long)pvVar2 + 0x48) = plVar4;
  }
  return plVar3;
}

Assistant:

static struct llama_sampler * llama_sampler_grammar_clone(const struct llama_sampler * smpl) {
    const auto * ctx = (const llama_sampler_grammar *) smpl->ctx;

    auto * result = llama_sampler_init_grammar_impl(ctx->vocab, nullptr, nullptr, false, nullptr, 0, nullptr, 0, nullptr, 0);
    GGML_ASSERT(result);

    // copy the state
    {
        auto * result_ctx = (llama_sampler_grammar *) result->ctx;

        if (ctx->grammar) {
            result_ctx->grammar_str  = ctx->grammar_str;
            result_ctx->grammar_root = ctx->grammar_root;

            result_ctx->grammar = llama_grammar_clone_impl(*ctx->grammar);
        }
    }

    return result;
}